

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O3

void __thiscall absl::SetAndroidNativeTag(absl *this,char *tag)

{
  undefined *puVar1;
  __base_type _Var2;
  size_t sVar3;
  absl *this_00;
  string death_message;
  absl local_30 [32];
  
  if (this == (absl *)0x0) {
    SetAndroidNativeTag(local_30);
    this = (absl *)tag;
  }
  else {
    _Var2._M_p = (__pointer_type)operator_new(0x20);
    ((_Var2._M_p)->_M_dataplus)._M_p = (pointer)&(_Var2._M_p)->field_2;
    sVar3 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>((string *)_Var2._M_p,this,this + sVar3);
    puVar1 = (anonymous_namespace)::android_log_tag;
    (anonymous_namespace)::android_log_tag = ((_Var2._M_p)->_M_dataplus)._M_p;
    LOCK();
    UNLOCK();
    if (puVar1 == "native") {
      SetAndroidNativeTag(char_const*)::user_log_tag_abi_cxx11_._M_b._M_p =
           (__base_type)(__base_type)_Var2._M_p;
      return;
    }
  }
  this_00 = local_30;
  SetAndroidNativeTag(this_00);
  if (_ZN4absl12_GLOBAL__N_121log_backtrace_at_hashE_0 != 0) {
    hash_internal::MixingHashState::combine_contiguous
              ((MixingHashState)0x192de0,(uchar *)this,(size_t)this_00);
  }
  return;
}

Assistant:

void SetAndroidNativeTag(const char* tag) {
  ABSL_CONST_INIT static std::atomic<const std::string*> user_log_tag(nullptr);
  ABSL_INTERNAL_CHECK(tag, "tag must be non-null.");

  const std::string* tag_str = new std::string(tag);
  ABSL_INTERNAL_CHECK(
      android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) ==
          kDefaultAndroidTag,
      "SetAndroidNativeTag() must only be called once per process!");
  user_log_tag.store(tag_str, std::memory_order_relaxed);
}